

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QHash<QStyle::SubControl,_QRect> __thiscall
QStyleSheetStyle::titleBarLayout(QStyleSheetStyle *this,QWidget *w,QStyleOptionTitleBar *tb)

{
  uint uVar1;
  QLatin1StringView sh;
  QByteArrayView layout_00;
  bool bVar2;
  int iVar3;
  const_iterator o;
  const_iterator o_00;
  ButtonInfo *pBVar4;
  QRect *pQVar5;
  long in_RCX;
  Data *in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  QRect QVar7;
  ButtonInfo *info_1;
  add_const_t<QList<(anonymous_namespace)::ButtonInfo>_> *__range1_1;
  int element;
  QVariant *val;
  add_const_t<QList<QVariant>_> *__range1;
  Where where;
  bool isMaximized;
  bool isMinimized;
  QHash<QStyle::SubControl,_QRect> *layoutRects;
  SubControl control;
  QRect r;
  QRect lr;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<(anonymous_namespace)::ButtonInfo> infos;
  QList<QVariant> layout;
  QRect cr;
  ButtonInfo info;
  QRenderRule subRule;
  int offsets [3];
  int in_stack_fffffffffffffc48;
  WindowType in_stack_fffffffffffffc4c;
  enum_type in_stack_fffffffffffffc50;
  enum_type in_stack_fffffffffffffc54;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  QRenderRule *in_stack_fffffffffffffc68;
  QRect *in_stack_fffffffffffffc70;
  QList<(anonymous_namespace)::ButtonInfo> *in_stack_fffffffffffffc78;
  Data *pDVar8;
  undefined1 **ppuVar9;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  int in_stack_fffffffffffffcc4;
  QRenderRule *in_stack_fffffffffffffcc8;
  QWidget *w_00;
  undefined4 in_stack_fffffffffffffcd8;
  uint uVar10;
  undefined8 local_2e4;
  undefined8 local_2dc;
  const_iterator local_298;
  QSize local_290;
  QFlagsStorageHelper<Qt::WindowType,_4> local_288;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffd7c;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffd80;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffd84;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffd88;
  QFlagsStorage<Qt::WindowType> in_stack_fffffffffffffd8c;
  QStyleSheetStyle *in_stack_fffffffffffffd90;
  const_iterator this_00;
  const_iterator local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  QLatin1StringView local_240;
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  undefined1 local_1f0 [152];
  undefined1 *local_158;
  undefined1 *puStack_150;
  undefined1 *local_148;
  undefined1 *puStack_140;
  undefined1 *local_138;
  undefined1 *puStack_130;
  undefined1 *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_c0 [140];
  int local_34 [3];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  pDVar8 = in_RDI;
  QHash<QStyle::SubControl,_QRect>::QHash((QHash<QStyle::SubControl,_QRect> *)in_RDI);
  bVar6 = (*(uint *)(in_RCX + 0x68) & 1) != 0;
  uVar1 = *(uint *)(in_RCX + 0x68);
  memset(local_c0,0xaa,0x88);
  renderRule(in_stack_fffffffffffffd90,
             (QObject *)CONCAT44(in_stack_fffffffffffffd8c.i,in_stack_fffffffffffffd88.i),
             (QStyleOption *)CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80.i),
             in_stack_fffffffffffffd7c.i);
  local_1f0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_1f0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_1f0._0_16_ =
       (undefined1  [16])
       QRenderRule::contentsRect
                 (in_stack_fffffffffffffc68,
                  (QRect *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  local_208._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_208._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1
            ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58.i),
             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  sh.m_size._4_4_ = in_stack_fffffffffffffc64;
  sh.m_size._0_4_ = in_stack_fffffffffffffc60;
  sh.m_data = (char *)in_stack_fffffffffffffc68;
  QRenderRule::styleHint
            ((QRenderRule *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),sh);
  ::QVariant::toList();
  ::QVariant::~QVariant(&local_28);
  bVar2 = QList<QVariant>::isEmpty((QList<QVariant> *)0x41e39c);
  if (bVar2) {
    local_240 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58.i),
                           CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    QByteArrayView::QByteArrayView<QLatin1String,_true>
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               (QLatin1String *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58.i));
    layout_00.m_data = (storage_type *)pDVar8;
    layout_00.m_size = (qsizetype)in_RDI;
    subControlLayout(layout_00);
    QList<QVariant>::operator=
              ((QList<QVariant> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
               (QList<QVariant> *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    QList<QVariant>::~QList((QList<QVariant> *)0x41e417);
  }
  memset(local_34,0,0xc);
  uVar10 = 0;
  local_258 = &DAT_aaaaaaaaaaaaaaaa;
  local_250 = &DAT_aaaaaaaaaaaaaaaa;
  local_248 = &DAT_aaaaaaaaaaaaaaaa;
  QList<(anonymous_namespace)::ButtonInfo>::QList
            ((QList<(anonymous_namespace)::ButtonInfo> *)0x41e470);
  QList<QVariant>::size((QList<QVariant> *)local_208);
  QList<(anonymous_namespace)::ButtonInfo>::reserve
            (in_stack_fffffffffffffc78,CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
            );
  w_00 = (QWidget *)local_208;
  local_260.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_260 = QList<QVariant>::begin
                        ((QList<QVariant> *)
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  o = QList<QVariant>::end
                ((QList<QVariant> *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
  do {
    this_00 = o;
    bVar2 = QList<QVariant>::const_iterator::operator!=(&local_260,o);
    if (!bVar2) {
      ppuVar9 = &local_258;
      local_298.i = (ButtonInfo *)&DAT_aaaaaaaaaaaaaaaa;
      local_298 = QList<(anonymous_namespace)::ButtonInfo>::begin
                            ((QList<(anonymous_namespace)::ButtonInfo> *)
                             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      o_00 = QList<(anonymous_namespace)::ButtonInfo>::end
                       ((QList<(anonymous_namespace)::ButtonInfo> *)
                        CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      while (bVar2 = QList<(anonymous_namespace)::ButtonInfo>::const_iterator::operator!=
                               (&local_298,o_00), bVar2) {
        pBVar4 = QList<(anonymous_namespace)::ButtonInfo>::const_iterator::operator*(&local_298);
        iVar3 = pBVar4->where;
        if (iVar3 == 0) {
          QRect::translate((QRect *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                           in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
          QRect::setWidth((QRect *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                          in_stack_fffffffffffffc4c);
        }
        else if (iVar3 == 1) {
          QRect::right((QRect *)0x41ec45);
          QRect::moveLeft((QRect *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                          in_stack_fffffffffffffc4c);
          QRect::setWidth((QRect *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                          in_stack_fffffffffffffc4c);
        }
        else if (iVar3 == 2) {
          QRect::left((QRect *)0x41eaef);
          QRect::setLeft((QRect *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         in_stack_fffffffffffffc4c);
          QRect::right((QRect *)0x41eb12);
          QRect::setRight((QRect *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                          in_stack_fffffffffffffc4c);
          in_stack_fffffffffffffc5c = local_34[2];
          QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58.i),
                       in_stack_fffffffffffffc54,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                       ,in_stack_fffffffffffffc48);
          QRect::center(in_stack_fffffffffffffc70);
          QRect::moveCenter((QRect *)in_stack_fffffffffffffc68,
                            (QPoint *)CONCAT44(in_stack_fffffffffffffc64,iVar3));
          QRect::left((QRect *)0x41ebad);
          QRect::setLeft((QRect *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         in_stack_fffffffffffffc4c);
          QRect::setWidth((QRect *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                          in_stack_fffffffffffffc4c);
        }
        QVar7 = positionRect((QStyleSheetStyle *)CONCAT44(uVar10,in_stack_fffffffffffffcd8),w_00,
                             in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4,
                             (QRect *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                             (LayoutDirection)((ulong)ppuVar9 >> 0x20));
        pQVar5 = QHash<QStyle::SubControl,_QRect>::operator[]
                           ((QHash<QStyle::SubControl,_QRect> *)
                            CONCAT44(in_stack_fffffffffffffc64,iVar3),
                            (SubControl *)
                            CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58.i));
        local_2e4 = QVar7._0_8_;
        pQVar5->x1 = (Representation)(undefined4)local_2e4;
        pQVar5->y1 = (Representation)local_2e4._4_4_;
        local_2dc = QVar7._8_8_;
        pQVar5->x2 = (Representation)(undefined4)local_2dc;
        pQVar5->y2 = (Representation)local_2dc._4_4_;
        QList<(anonymous_namespace)::ButtonInfo>::const_iterator::operator++(&local_298);
      }
      QList<(anonymous_namespace)::ButtonInfo>::~QList
                ((QList<(anonymous_namespace)::ButtonInfo> *)0x41ed46);
      QList<QVariant>::~QList((QList<QVariant> *)0x41ed53);
      QRenderRule::~QRenderRule
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return (QHash<QStyle::SubControl,_QRect>)pDVar8;
    }
    in_stack_fffffffffffffcc8 =
         (QRenderRule *)QList<QVariant>::const_iterator::operator*(&local_260);
    in_stack_fffffffffffffcc4 = ::QVariant::toInt((bool *)in_stack_fffffffffffffcc8);
    if (in_stack_fffffffffffffcc4 == 0x28) {
      uVar10 = 2;
    }
    else if (in_stack_fffffffffffffcc4 == 0x29) {
      uVar10 = 1;
    }
    else {
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
      local_138 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
      local_148 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
      local_158 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
      anon_unknown.dwarf_477e63::ButtonInfo::ButtonInfo((ButtonInfo *)0x41e602);
      uStack_d0 = (undefined1 *)CONCAT44(uStack_d0._4_4_,in_stack_fffffffffffffcc4);
      switch(in_stack_fffffffffffffcc4) {
      case 0x41:
        in_stack_fffffffffffffc70 = (QRect *)(in_RCX + 0x6c);
        Qt::operator|(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
        in_stack_fffffffffffffd8c.i =
             (Int)QFlags<Qt::WindowType>::operator&
                            ((QFlags<Qt::WindowType> *)
                             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                             in_stack_fffffffffffffc58.i);
        bVar2 = QFlags<Qt::WindowType>::operator!
                          ((QFlags<Qt::WindowType> *)&stack0xfffffffffffffd8c);
        if (bVar2) {
          in_stack_fffffffffffffcbc = 3;
        }
        else {
LAB_0041e828:
          if ((int)uStack_d0 == 0x41) {
            iVar3 = QFontMetrics::horizontalAdvance((QString *)(in_RCX + 0x20),(int)in_RCX + 0x48);
            local_c8._4_4_ = iVar3 + 6;
            in_stack_fffffffffffffc68 = (QRenderRule *)operator_new(0x1c);
            in_stack_fffffffffffffc64 = local_c8._4_4_;
            QFontMetrics::height();
            in_stack_fffffffffffffc48 = -1;
            QStyleSheetGeometryData::QStyleSheetGeometryData
                      ((QStyleSheetGeometryData *)
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                       in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58.i,
                       in_stack_fffffffffffffc54,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                       ,(int)in_stack_fffffffffffffc70);
            QSharedDataPointer<QStyleSheetGeometryData>::operator=
                      ((QSharedDataPointer<QStyleSheetGeometryData> *)
                       CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                       (QStyleSheetGeometryData *)
                       CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          }
          else {
            renderRule((QStyleSheetStyle *)this_00.i,
                       (QObject *)CONCAT44(in_stack_fffffffffffffd8c.i,in_stack_fffffffffffffd88.i),
                       (QStyleOption *)
                       CONCAT44(in_stack_fffffffffffffd84.i,in_stack_fffffffffffffd80.i),
                       in_stack_fffffffffffffd7c.i);
            QRenderRule::operator=
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                       (QRenderRule *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48))
            ;
            QRenderRule::~QRenderRule
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))
            ;
            local_290 = QRenderRule::size((QRenderRule *)
                                          CONCAT44(in_stack_fffffffffffffc5c,
                                                   in_stack_fffffffffffffc58.i));
            iVar3 = QSize::width((QSize *)0x41e936);
            local_c8._4_4_ = iVar3;
          }
          QRenderRule::operator=
                    ((QRenderRule *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (QRenderRule *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          uStack_d0 = (undefined1 *)CONCAT44(local_34[uVar10],(int)uStack_d0);
          local_c8 = (undefined1 *)CONCAT44(local_c8._4_4_,uVar10);
          local_34[uVar10] = local_c8._4_4_ + local_34[uVar10];
          QList<(anonymous_namespace)::ButtonInfo>::append
                    ((QList<(anonymous_namespace)::ButtonInfo> *)
                     CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (rvalue_ref)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          in_stack_fffffffffffffcbc = 0;
        }
        break;
      case 0x42:
      case 0x49:
        local_288.super_QFlagsStorage<Qt::WindowType>.i =
             (QFlagsStorage<Qt::WindowType>)
             QFlags<Qt::WindowType>::operator&
                       ((QFlags<Qt::WindowType> *)
                        CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                        in_stack_fffffffffffffc4c);
        bVar2 = QFlags<Qt::WindowType>::operator!((QFlags<Qt::WindowType> *)&local_288);
        if (!bVar2) goto LAB_0041e828;
        in_stack_fffffffffffffcbc = 3;
        break;
      case 0x43:
        in_stack_fffffffffffffd84.i =
             (Int)QFlags<Qt::WindowType>::operator&
                            ((QFlags<Qt::WindowType> *)
                             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                             in_stack_fffffffffffffc4c);
        bVar2 = QFlags<Qt::WindowType>::operator!
                          ((QFlags<Qt::WindowType> *)&stack0xfffffffffffffd84);
        if (!bVar2) {
          if (bVar6) {
            uStack_d0 = (undefined1 *)CONCAT44(uStack_d0._4_4_,0x47);
          }
          goto LAB_0041e828;
        }
        in_stack_fffffffffffffcbc = 3;
        break;
      case 0x44:
        in_stack_fffffffffffffd80.i =
             (Int)QFlags<Qt::WindowType>::operator&
                            ((QFlags<Qt::WindowType> *)
                             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                             in_stack_fffffffffffffc4c);
        bVar2 = QFlags<Qt::WindowType>::operator!
                          ((QFlags<Qt::WindowType> *)&stack0xfffffffffffffd80);
        if (!bVar2) {
          if ((uVar1 & 2) != 0) {
            uStack_d0 = (undefined1 *)CONCAT44(uStack_d0._4_4_,0x47);
          }
          goto LAB_0041e828;
        }
        in_stack_fffffffffffffcbc = 3;
        break;
      case 0x45:
        in_stack_fffffffffffffd7c.i =
             (Int)QFlags<Qt::WindowType>::operator&
                            ((QFlags<Qt::WindowType> *)
                             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                             in_stack_fffffffffffffc4c);
        bVar2 = QFlags<Qt::WindowType>::operator!
                          ((QFlags<Qt::WindowType> *)&stack0xfffffffffffffd7c);
        if (!bVar2) {
          if (bVar6) {
            uStack_d0 = (undefined1 *)CONCAT44(uStack_d0._4_4_,0x46);
          }
          goto LAB_0041e828;
        }
        in_stack_fffffffffffffcbc = 3;
        break;
      default:
        in_stack_fffffffffffffcbc = 3;
        break;
      case 0x48:
        in_stack_fffffffffffffd88.i =
             (Int)QFlags<Qt::WindowType>::operator&
                            ((QFlags<Qt::WindowType> *)
                             CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                             in_stack_fffffffffffffc4c);
        bVar2 = QFlags<Qt::WindowType>::operator!
                          ((QFlags<Qt::WindowType> *)&stack0xfffffffffffffd88);
        if (!bVar2) goto LAB_0041e828;
        in_stack_fffffffffffffcbc = 3;
      }
      anon_unknown.dwarf_477e63::ButtonInfo::~ButtonInfo((ButtonInfo *)0x41e9bb);
    }
    QList<QVariant>::const_iterator::operator++(&local_260);
  } while( true );
}

Assistant:

QHash<QStyle::SubControl, QRect> QStyleSheetStyle::titleBarLayout(const QWidget *w, const QStyleOptionTitleBar *tb) const
{
    QHash<QStyle::SubControl, QRect> layoutRects;
    const bool isMinimized = tb->titleBarState & Qt::WindowMinimized;
    const bool isMaximized = tb->titleBarState & Qt::WindowMaximized;
    QRenderRule subRule = renderRule(w, tb);
    QRect cr = subRule.contentsRect(tb->rect);
    QList<QVariant> layout = subRule.styleHint("button-layout"_L1).toList();
    if (layout.isEmpty())
        layout = subControlLayout("I(T)HSmMX"_L1);

    int offsets[3] = { 0, 0, 0 };
    enum Where { Left, Right, Center, NoWhere } where = Left;
    QList<ButtonInfo> infos;
    infos.reserve(layout.size());
    for (const QVariant &val : std::as_const(layout)) {
        const int element = val.toInt();
        if (element == '(') {
            where = Center;
        } else if (element == ')') {
            where = Right;
        } else {
            ButtonInfo info;
            info.element = element;
            switch (element) {
            case PseudoElement_TitleBar:
                if (!(tb->titleBarFlags & (Qt::WindowTitleHint | Qt::WindowSystemMenuHint)))
                    continue;
                break;
            case PseudoElement_TitleBarContextHelpButton:
                if (!(tb->titleBarFlags & Qt::WindowContextHelpButtonHint))
                    continue;
                break;
            case PseudoElement_TitleBarMinButton:
                if (!(tb->titleBarFlags & Qt::WindowMinimizeButtonHint))
                    continue;
                if (isMinimized)
                    info.element = PseudoElement_TitleBarNormalButton;
                break;
            case PseudoElement_TitleBarMaxButton:
                if (!(tb->titleBarFlags & Qt::WindowMaximizeButtonHint))
                    continue;
                if (isMaximized)
                    info.element = PseudoElement_TitleBarNormalButton;
                break;
            case PseudoElement_TitleBarShadeButton:
                if (!(tb->titleBarFlags & Qt::WindowShadeButtonHint))
                    continue;
                if (isMinimized)
                    info.element = PseudoElement_TitleBarUnshadeButton;
                break;
            case PseudoElement_TitleBarCloseButton:
            case PseudoElement_TitleBarSysMenu:
                if (!(tb->titleBarFlags & Qt::WindowSystemMenuHint))
                    continue;
                break;
            default:
                continue;
            }
            if (info.element == PseudoElement_TitleBar) {
                info.width = tb->fontMetrics.horizontalAdvance(tb->text) + 6;
                subRule.geo = new QStyleSheetGeometryData(info.width, tb->fontMetrics.height(), -1, -1, -1, -1);
            } else {
                subRule = renderRule(w, tb, info.element);
                info.width = subRule.size().width();
            }
            info.rule = subRule;
            info.offset = offsets[where];
            info.where = where;
            offsets[where] += info.width;

            infos.append(std::move(info));
        }
    }

    for (const ButtonInfo &info : std::as_const(infos)) {
        QRect lr = cr;
        switch (info.where) {
        case Center: {
            lr.setLeft(cr.left() + offsets[Left]);
            lr.setRight(cr.right() - offsets[Right]);
            QRect r(0, 0, offsets[Center], lr.height());
            r.moveCenter(lr.center());
            r.setLeft(r.left()+info.offset);
            r.setWidth(info.width);
            lr = r;
            break; }
        case Left:
            lr.translate(info.offset, 0);
            lr.setWidth(info.width);
            break;
        case Right:
            lr.moveLeft(cr.right() + 1 - offsets[Right] + info.offset);
            lr.setWidth(info.width);
            break;
        default:
            break;
        }
        QStyle::SubControl control = knownPseudoElements[info.element].subControl;
        layoutRects[control] = positionRect(w, info.rule, info.element, lr, tb->direction);
    }

    return layoutRects;
}